

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O1

apx_error_t apx_nodeInstance_finalize_node_data(apx_nodeInstance_t *self)

{
  apx_nodeData_t *self_00;
  int iVar1;
  apx_error_t aVar2;
  
  if (self == (apx_nodeInstance_t *)0x0) {
    iVar1 = 1;
  }
  else {
    self_00 = self->node_data;
    if (self_00 == (apx_nodeData_t *)0x0) {
      iVar1 = 0x24;
    }
    else {
      if (self->provide_port_init_data == (uint8_t *)0x0) {
        iVar1 = 0;
      }
      else {
        iVar1 = apx_nodeData_create_provide_port_data
                          (self_00,self->num_provide_ports,self->provide_port_init_data,
                           self->provide_port_init_data_size);
      }
      if (iVar1 == 0) {
        if (self->require_port_init_data != (uint8_t *)0x0) {
          aVar2 = apx_nodeData_create_require_port_data
                            (self_00,self->num_require_ports,self->require_port_init_data,
                             self->require_port_init_data_size);
          return aVar2;
        }
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

apx_error_t apx_nodeInstance_finalize_node_data(apx_nodeInstance_t* self)
{
   if (self != NULL)
   {
      apx_error_t retval = APX_NO_ERROR;
      apx_nodeData_t* node_data = self->node_data;
      if (node_data != NULL)
      {
         if (apx_nodeInstance_has_provide_port_data(self))
         {
            retval = apx_nodeData_create_provide_port_data(node_data, self->num_provide_ports, self->provide_port_init_data, self->provide_port_init_data_size);
         }
         if ((retval == APX_NO_ERROR) && apx_nodeInstance_has_require_port_data(self))
         {
            retval = apx_nodeData_create_require_port_data(node_data, self->num_require_ports, self->require_port_init_data, self->require_port_init_data_size);
         }
      }
      else
      {
         retval = APX_NULL_PTR_ERROR;
      }
      return retval;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}